

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InlinePass::AddPointerToType
          (InlinePass *this,uint32_t type_id,StorageClass storage_class)

{
  uint32_t res_id;
  Instruction *this_00;
  TypeManager *pTVar1;
  long lVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_110;
  IRContext *local_108;
  uint32_t local_100;
  StorageClass local_fc;
  Type *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  undefined1 local_b8 [48];
  float local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  Type *pointeeTy;
  
  res_id = IRContext::TakeNextId((this->super_Pass).context_);
  if (res_id != 0) {
    this_00 = (Instruction *)operator_new(0x70);
    local_108 = (this->super_Pass).context_;
    init_list._M_len = 1;
    init_list._M_array = &local_fc;
    local_fc = storage_class;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
    local_b8._0_4_ = 0x11;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&local_e0);
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_100;
    local_100 = type_id;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&pointeeTy,init_list_00);
    local_88 = 1.4013e-45;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_80,(SmallVector<unsigned_int,_2UL> *)&pointeeTy);
    local_f8 = (Type *)0x0;
    uStack_f0 = 0;
    local_e8 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_f8,
               local_b8,&pointeeTy);
    Instruction::Instruction(this_00,local_108,OpTypePointer,0,res_id,(OperandList *)&local_f8);
    local_110._M_head_impl = this_00;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_f8)
    ;
    lVar2 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_b8 + lVar2));
      lVar2 = lVar2 + -0x30;
    } while (lVar2 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&pointeeTy);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
    IRContext::AddType((this->super_Pass).context_,
                       (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)&local_110);
    local_f8 = (Type *)0x0;
    pTVar1 = IRContext::get_type_mgr((this->super_Pass).context_);
    analysis::TypeManager::GetTypeAndPointerType((TypeManager *)local_b8,(uint32_t)pTVar1,type_id);
    local_e0._vptr_SmallVector = (_func_int **)&local_f8;
    local_e0.size_ = (size_t)&pointeeTy;
    std::
    tuple<spvtools::opt::analysis::Type*&,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>&>
    ::operator=((tuple<spvtools::opt::analysis::Type*&,std::unique_ptr<spvtools::opt::analysis::Pointer,std::default_delete<spvtools::opt::analysis::Pointer>>&>
                 *)&local_e0,
                (pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
                 *)local_b8);
    if ((IRContext *)local_b8._8_8_ != (IRContext *)0x0) {
      (*(code *)(*(spv_context *)local_b8._8_8_)->opcode_table)();
    }
    pTVar1 = IRContext::get_type_mgr((this->super_Pass).context_);
    analysis::TypeManager::RegisterType(pTVar1,res_id,local_f8);
    if (local_f8 != (Type *)0x0) {
      (*local_f8->_vptr_Type[1])();
    }
    if (local_110._M_head_impl != (Instruction *)0x0) {
      (*((local_110._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  return res_id;
}

Assistant:

uint32_t InlinePass::AddPointerToType(uint32_t type_id,
                                      spv::StorageClass storage_class) {
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return resultId;
  }

  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  analysis::Type* pointeeTy;
  std::unique_ptr<analysis::Pointer> pointerTy;
  std::tie(pointeeTy, pointerTy) =
      context()->get_type_mgr()->GetTypeAndPointerType(
          type_id, spv::StorageClass::Function);
  context()->get_type_mgr()->RegisterType(resultId, *pointerTy);
  return resultId;
}